

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

bool __thiscall
capnp::_::StructReader::isCanonical
          (StructReader *this,word **readHead,word **ptrHead,bool *dataTrunc,bool *ptrTrunc)

{
  uint uVar1;
  bool bVar2;
  ushort uVar3;
  word *pwVar4;
  bool bVar5;
  unsigned_short ptrIndex;
  ulong uVar6;
  PointerReader local_58;
  
  pwVar4 = *readHead;
  if (((word *)this->data == pwVar4) && (uVar1 = this->dataSize, (uVar1 & 0x3f) == 0)) {
    bVar2 = true;
    bVar5 = true;
    if (uVar1 != 0) {
      bVar5 = ((word *)this->data)[(uVar1 >> 6) - 1].content != 0;
    }
    *dataTrunc = bVar5;
    if (this->pointerCount == 0) {
      uVar3 = 0;
    }
    else {
      local_58.pointer = this->pointers + (this->pointerCount - 1);
      local_58.nestingLimit = this->nestingLimit;
      local_58.segment = this->segment;
      local_58.capTable = this->capTable;
      bVar2 = PointerReader::isNull(&local_58);
      bVar2 = !bVar2;
      uVar3 = this->pointerCount;
      pwVar4 = *readHead;
    }
    *ptrTrunc = bVar2;
    *readHead = pwVar4 + ((uVar1 >> 6) + (uint)uVar3);
    uVar6 = 0;
    do {
      bVar2 = uVar6 == uVar3;
      if (bVar2) {
        return bVar2;
      }
      if (uVar6 < this->pointerCount) {
        local_58.pointer = this->pointers + uVar6;
        local_58.nestingLimit = this->nestingLimit;
        local_58.segment = this->segment;
        local_58.capTable = this->capTable;
      }
      else {
        local_58.segment = (SegmentReader *)0x0;
        local_58.capTable = (CapTableReader *)0x0;
        local_58.pointer = (WirePointer *)0x0;
        local_58.nestingLimit = 0x7fffffff;
      }
      bVar5 = PointerReader::isCanonical(&local_58,ptrHead);
      uVar6 = uVar6 + 1;
    } while (bVar5);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool StructReader::isCanonical(const word **readHead,
                               const word **ptrHead,
                               bool *dataTrunc,
                               bool *ptrTrunc) {
  if (this->getLocation() != *readHead) {
    // Our target area is not at the readHead, preorder fails
    return false;
  }

  if (this->getDataSectionSize() % BITS_PER_WORD != ZERO * BITS) {
    // Using legacy non-word-size structs, reject
    return false;
  }
  auto dataSize = this->getDataSectionSize() / BITS_PER_WORD;

  // Mark whether the struct is properly truncated
  KJ_IF_SOME(diff, trySubtract(dataSize, ONE * WORDS)) {
    *dataTrunc = this->getDataField<uint64_t>(diff / WORDS * ELEMENTS) != 0;
  } else {
    // Data segment empty.
    *dataTrunc = true;
  }